

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O1

void __thiscall Memory::HeapAllocator::DestroyPrivateHeap(HeapAllocator *this)

{
  if (this->m_privateHeap != (HANDLE)0x0) {
    this->m_privateHeap = (HANDLE)0x0;
  }
  return;
}

Assistant:

void HeapAllocator::DestroyPrivateHeap()
{
    if (this->m_privateHeap != nullptr)
    {
        // xplat-todo: PAL no HeapDestroy?
#ifdef _WIN32
        BOOL success = HeapDestroy(this->m_privateHeap);
        Assert(success);
#endif
        this->m_privateHeap = nullptr;
    }
}